

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void tscpm_linear_transform
               (pel *pSrc,int iSrcStride,pel *pDst,int iDstStride,int a_u,int b_u,int a_v,int b_v,
               int iShift,int uiWidth,int uiHeight,int bitDept)

{
  int iVar1;
  int local_60;
  pel local_5c;
  int local_58;
  int local_54;
  pel local_50;
  int local_4c;
  byte local_48;
  int tempValue_v;
  int tempValue_u;
  int i2;
  int i;
  int j;
  int maxResult;
  int b_u_local;
  int a_u_local;
  int iDstStride_local;
  pel *pDst_local;
  pel *ppStack_10;
  int iSrcStride_local;
  pel *pSrc_local;
  
  iVar1 = (1 << ((byte)bitDept & 0x1f)) + -1;
  if (iShift < 0) {
    local_48 = 0;
  }
  else {
    local_48 = (byte)iShift;
  }
  _a_u_local = pDst;
  ppStack_10 = pSrc;
  for (i2 = 0; i2 < uiHeight; i2 = i2 + 1) {
    for (tempValue_u = 0; tempValue_u < uiWidth; tempValue_u = tempValue_u + 1) {
      local_54 = (int)((long)((long)a_u * (ulong)ppStack_10[tempValue_u]) >> (local_48 & 0x3f)) +
                 b_u;
      local_60 = (int)((long)((long)a_v * (ulong)ppStack_10[tempValue_u]) >> (local_48 & 0x3f)) +
                 b_v;
      local_4c = local_54;
      if (iVar1 < local_54) {
        local_4c = iVar1;
      }
      if (local_4c < 0) {
        local_50 = '\0';
      }
      else {
        if (iVar1 < local_54) {
          local_54 = iVar1;
        }
        local_50 = (pel)local_54;
      }
      _a_u_local[tempValue_u * 2] = local_50;
      local_58 = local_60;
      if (iVar1 < local_60) {
        local_58 = iVar1;
      }
      if (local_58 < 0) {
        local_5c = '\0';
      }
      else {
        if (iVar1 < local_60) {
          local_60 = iVar1;
        }
        local_5c = (pel)local_60;
      }
      _a_u_local[tempValue_u * 2 + 1] = local_5c;
    }
    _a_u_local = _a_u_local + iDstStride;
    ppStack_10 = ppStack_10 + iSrcStride;
  }
  return;
}

Assistant:

void tscpm_linear_transform(pel *pSrc, int iSrcStride, pel *pDst, int iDstStride, int a_u, int b_u, int a_v, int b_v, int iShift, int uiWidth, int uiHeight, int bitDept)
{
    int maxResult = (1 << bitDept) - 1;

    iShift = (iShift >= 0 ? iShift : 0);

    for (int j = 0; j < uiHeight; j++)
    {
        for (int i = 0; i < uiWidth; i++)
        {
            int i2 = i << 1;
            int tempValue_u = (((s64)a_u * pSrc[i]) >> iShift) + b_u;
            int tempValue_v = (((s64)a_v * pSrc[i]) >> iShift) + b_v;
            pDst[i2    ] = COM_CLIP3(0, maxResult, tempValue_u);
            pDst[i2 + 1] = COM_CLIP3(0, maxResult, tempValue_v);
        }
        pDst += iDstStride;
        pSrc += iSrcStride;
    }
}